

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

PropertyDeclarationSyntax * __thiscall
slang::parsing::Parser::parsePropertyDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  AssertionItemPortListSyntax *portList;
  PropertySpecSyntax *propertySpec;
  NamedBlockClauseSyntax *endBlock;
  undefined4 extraout_var;
  PropertyDeclarationSyntax *pPVar3;
  EVP_PKEY_CTX *src;
  Token keyword;
  Token nameToken;
  Token semi;
  Token optionalSemi;
  Token end;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_d0;
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> declarations;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> local_60;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  nameToken = ParserBase::expect(&this->super_ParserBase,Identifier);
  portList = parseAssertionItemPortList(this,PropertyDeclaration);
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.data_ =
       (pointer)declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.
                firstElement;
  declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.len = 0;
  declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.cap = 5;
  while( true ) {
    bVar1 = isLocalVariableDeclaration(this);
    if (!bVar1) break;
    local_d0.super_SyntaxListBase._vptr_SyntaxListBase =
         (_func_int **)parseLocalVariableDeclaration(this);
    SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*>::
    emplace_back<slang::syntax::LocalVariableDeclarationSyntax*>
              ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*> *)&declarations,
               (LocalVariableDeclarationSyntax **)&local_d0);
  }
  propertySpec = parsePropertySpec(this);
  optionalSemi = ParserBase::consumeIf(&this->super_ParserBase,Semicolon);
  end = ParserBase::expect(&this->super_ParserBase,EndPropertyKeyword);
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,nameToken,endBlock);
  local_d0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_d0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_d0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004703a8;
  local_d0.super_SyntaxListBase.childCount = attributes.size_;
  local_d0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       attributes.data_;
  local_d0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       attributes.size_;
  iVar2 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::copy
                    (&declarations.
                      super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_60.super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.data_
       = (pointer)CONCAT44(extraout_var,iVar2);
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004739f0;
  pPVar3 = slang::syntax::SyntaxFactory::propertyDeclaration
                     (&this->factory,&local_d0,keyword,nameToken,portList,semi,&local_60,
                      propertySpec,optionalSemi,end,endBlock);
  SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::~SmallVectorBase
            (&declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>);
  return pPVar3;
}

Assistant:

PropertyDeclarationSyntax& Parser::parsePropertyDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::PropertyDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    SmallVector<LocalVariableDeclarationSyntax*> declarations;
    while (isLocalVariableDeclaration())
        declarations.push_back(&parseLocalVariableDeclaration());

    auto& spec = parsePropertySpec();
    Token optSemi = consumeIf(TokenKind::Semicolon);
    Token end = expect(TokenKind::EndPropertyKeyword);

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.propertyDeclaration(attributes, keyword, name, portList, semi,
                                       declarations.copy(alloc), spec, optSemi, end, blockName);
}